

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_load_lines.c
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE *__stream;
  char *__s1;
  char *rc;
  FILE *fh;
  
  __stream = fopen("test_lines.txt","w+");
  if (__stream == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lines.c, line %d - %s\n"
           ,0x40,"fh != NULL");
  }
  iVar1 = fputs("Foo\n\nBar\n",__stream);
  if (iVar1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lines.c, line %d - %s\n"
           ,0x41,"fputs( \"Foo\\n\\nBar\\n\", fh ) != EOF");
  }
  rewind(__stream);
  __s1 = _PDCLIB_load_lines((FILE *)__stream,3);
  fclose(__stream);
  remove("test_lines.txt");
  if (__s1 == (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lines.c, line %d - %s\n"
           ,0x48,"rc != NULL");
  }
  iVar1 = strcmp(__s1,"Foo");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lines.c, line %d - %s\n"
           ,0x49,"strcmp( rc, \"Foo\" ) == 0");
  }
  iVar1 = strcmp(__s1 + 4,"");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lines.c, line %d - %s\n"
           ,0x4a,"strcmp( rc + 4, \"\" ) == 0");
  }
  iVar1 = strcmp(__s1 + 5,"Bar");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_load_lines.c, line %d - %s\n"
           ,0x4b,"strcmp( rc + 5, \"Bar\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    FILE * fh = fopen( "test_lines.txt", "w+" );
    char * rc;

    TESTCASE( fh != NULL );
    TESTCASE( fputs( "Foo\n\nBar\n", fh ) != EOF );

    rewind( fh );
    rc = _PDCLIB_load_lines( fh, 3 );
    fclose( fh );
    remove( "test_lines.txt" );

    TESTCASE( rc != NULL );
    TESTCASE( strcmp( rc, "Foo" ) == 0 );
    TESTCASE( strcmp( rc + 4, "" ) == 0 );
    TESTCASE( strcmp( rc + 5, "Bar" ) == 0 );

#endif
    return TEST_RESULTS;
}